

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.cpp
# Opt level: O3

Literal * __thiscall
wasm::extend<2ul,unsigned_int,unsigned_long,(wasm::LaneOrder)1>
          (Literal *__return_storage_ptr__,wasm *this,Literal *vec)

{
  Type *other;
  Literal *pLVar1;
  bool bVar2;
  long lVar3;
  bool bVar4;
  undefined1 local_d8 [8];
  LaneArray<2UL_*_2> lanes;
  LaneArray<2UL> result;
  
  getLanes<unsigned_int,4>((LaneArray<4> *)local_d8,this,vec);
  result._M_elems[1].field_0.i64 = 0;
  result._M_elems[1].field_0.func.super_IString.str._M_str = (char *)0x0;
  result._M_elems[0].field_0.func.super_IString.str._M_str = (char *)0x0;
  result._M_elems[0].type.id = 0;
  lanes._M_elems[3].type.id = 0;
  result._M_elems[0].field_0.i64 = 0;
  lVar3 = 2;
  other = &result._M_elems[1].type;
  bVar2 = true;
  pLVar1 = lanes._M_elems + 3;
  do {
    bVar4 = bVar2;
    if (lanes._M_elems[lVar3].field_0.func.super_IString.str._M_str != (char *)0x2) {
      __assert_fail("type == Type::i32",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/literal.h"
                    ,0x118,"int32_t wasm::Literal::geti32() const");
    }
    result._M_elems[1].type.id = (uintptr_t)(uint)lanes._M_elems[lVar3 + -1].type.id;
    Literal::~Literal((Literal *)&pLVar1->type);
    Literal::Literal((Literal *)&pLVar1->type,(Literal *)other);
    Literal::~Literal((Literal *)other);
    lVar3 = 3;
    bVar2 = false;
    pLVar1 = result._M_elems;
  } while (bVar4);
  Literal::Literal(__return_storage_ptr__,(LaneArray<2> *)&lanes._M_elems[3].type);
  lVar3 = 0x18;
  do {
    Literal::~Literal((Literal *)((long)&lanes._M_elems[3].type.id + lVar3));
    lVar3 = lVar3 + -0x18;
  } while (lVar3 != -0x18);
  lVar3 = 0x48;
  do {
    Literal::~Literal((Literal *)(local_d8 + lVar3));
    lVar3 = lVar3 + -0x18;
  } while (lVar3 != -0x18);
  return __return_storage_ptr__;
}

Assistant:

Literal extend(const Literal& vec) {
  LaneArray<Lanes* 2> lanes = getLanes<LaneFrom, Lanes * 2>(vec);
  LaneArray<Lanes> result;
  for (size_t i = 0; i < Lanes; ++i) {
    size_t idx = (Side == LaneOrder::Low) ? i : i + Lanes;
    result[i] = Literal((LaneTo)(LaneFrom)lanes[idx].geti32());
  }
  return Literal(result);
}